

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::CopyFileTime(string *fromFile,string *toFile)

{
  int iVar1;
  bool bVar2;
  utimbuf buf;
  stat fromStat;
  utimbuf local_a8;
  stat local_98;
  
  iVar1 = stat((fromFile->_M_dataplus)._M_p,&local_98);
  if (iVar1 < 0) {
    bVar2 = false;
  }
  else {
    local_a8.actime = local_98.st_atim.tv_sec;
    local_a8.modtime = local_98.st_mtim.tv_sec;
    iVar1 = utime((toFile->_M_dataplus)._M_p,&local_a8);
    bVar2 = -1 < iVar1;
  }
  return bVar2;
}

Assistant:

bool cmSystemTools::CopyFileTime(const std::string& fromFile,
                                 const std::string& toFile)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  cmSystemToolsWindowsHandle hFrom = CreateFileW(
    SystemTools::ConvertToWindowsExtendedPath(fromFile).c_str(), GENERIC_READ,
    FILE_SHARE_READ, 0, OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0);
  cmSystemToolsWindowsHandle hTo = CreateFileW(
    SystemTools::ConvertToWindowsExtendedPath(toFile).c_str(),
    FILE_WRITE_ATTRIBUTES, 0, 0, OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0);
  if (!hFrom || !hTo) {
    return false;
  }
  FILETIME timeCreation;
  FILETIME timeLastAccess;
  FILETIME timeLastWrite;
  if (!GetFileTime(hFrom, &timeCreation, &timeLastAccess, &timeLastWrite)) {
    return false;
  }
  return SetFileTime(hTo, &timeCreation, &timeLastAccess, &timeLastWrite) != 0;
#else
  struct stat fromStat;
  if (stat(fromFile.c_str(), &fromStat) < 0) {
    return false;
  }

  struct utimbuf buf;
  buf.actime = fromStat.st_atime;
  buf.modtime = fromStat.st_mtime;
  return utime(toFile.c_str(), &buf) >= 0;
#endif
}